

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

int __thiscall QSliderPrivate::pixelPosToRangeValue(QSliderPrivate *this,int pos)

{
  undefined8 uVar1;
  long lVar2;
  QWidget *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  int iVar6;
  QStyle *pQVar7;
  long lVar8;
  undefined8 *puVar9;
  QStyleOptionSlider *pQVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  QStyleOptionSlider opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar9 = &DAT_00661f50;
  pQVar10 = &opt;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar1 = *puVar9;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar9 = puVar9 + 1;
    pQVar10 = (QStyleOptionSlider *)&(pQVar10->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&opt);
  pQVar7 = QWidget::style(this_00);
  auVar11 = (**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,3,&opt,1,this_00);
  auVar4 = auVar11._0_12_;
  pQVar7 = QWidget::style(this_00);
  auVar12 = (**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,3,&opt,2,this_00);
  auVar5 = auVar12._0_12_;
  if ((this->super_QAbstractSliderPrivate).orientation != Horizontal) {
    auVar3._8_8_ = auVar12._8_8_ >> 0x20;
    auVar3._0_8_ = auVar12._0_8_ >> 0x20;
    auVar5 = auVar3._0_12_;
    auVar12._8_8_ = auVar11._8_8_ >> 0x20;
    auVar12._0_8_ = auVar11._0_8_ >> 0x20;
    auVar4 = auVar12._0_12_;
  }
  iVar6 = QStyle::sliderValueFromPosition
                    (*(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254,
                     (this->super_QAbstractSliderPrivate).maximum,pos - auVar4._0_4_,
                     (auVar4._8_4_ + auVar5._0_4_) - (auVar5._8_4_ + auVar4._0_4_),opt.upsideDown);
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QSliderPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }
    return QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                           sliderMax - sliderMin, opt.upsideDown);
}